

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_bwe.c
# Opt level: O0

int WebRtcIsac_EstimateBandwidth
              (BwEstimatorstr *bwest_str,Bitstr *streamdata,size_t packet_size,
              uint16_t rtp_seq_number,uint32_t send_ts,uint32_t arr_ts,
              IsacSamplingRate encoderSampRate,IsacSamplingRate decoderSampRate)

{
  int16_t iVar1;
  uint local_48;
  int err;
  uint32_t diffArrivalTime;
  uint32_t diffSendTime;
  uint32_t arrivalTimestampIn16kHz;
  uint32_t sendTimestampIn16kHz;
  int16_t frame_samples;
  int16_t index;
  uint32_t arr_ts_local;
  uint32_t send_ts_local;
  uint16_t rtp_seq_number_local;
  size_t packet_size_local;
  Bitstr *streamdata_local;
  BwEstimatorstr *bwest_str_local;
  
  sendTimestampIn16kHz = arr_ts;
  _frame_samples = send_ts;
  arr_ts_local._2_2_ = rtp_seq_number;
  _send_ts_local = packet_size;
  packet_size_local = (size_t)streamdata;
  streamdata_local = (Bitstr *)bwest_str;
  bwest_str_local._4_4_ = WebRtcIsac_DecodeFrameLen(streamdata,(int16_t *)&arrivalTimestampIn16kHz);
  if ((-1 < bwest_str_local._4_4_) &&
     (bwest_str_local._4_4_ =
           WebRtcIsac_DecodeSendBW
                     ((Bitstr *)packet_size_local,(int16_t *)((long)&arrivalTimestampIn16kHz + 2)),
     -1 < bwest_str_local._4_4_)) {
    iVar1 = WebRtcIsac_UpdateUplinkBwImpl
                      ((BwEstimatorstr *)streamdata_local,arrivalTimestampIn16kHz._2_2_,
                       encoderSampRate);
    bwest_str_local._4_4_ = (int)iVar1;
    if (-1 < bwest_str_local._4_4_) {
      err = _frame_samples - *(int *)(streamdata_local->stream + 0x70);
      *(uint32_t *)(streamdata_local->stream + 0x70) = _frame_samples;
      local_48 = sendTimestampIn16kHz - *(int *)(streamdata_local->stream + 0x74);
      *(uint32_t *)(streamdata_local->stream + 0x74) = sendTimestampIn16kHz;
      if (decoderSampRate == kIsacSuperWideband) {
        local_48 = local_48 >> 1;
        err = (uint)err >> 1;
      }
      iVar1 = WebRtcIsac_UpdateBandwidthEstimator
                        ((BwEstimatorstr *)streamdata_local,arr_ts_local._2_2_,
                         ((short)arrivalTimestampIn16kHz * 1000) / 16000,
                         *(int *)(streamdata_local->stream + 8) + err,
                         *(int *)(streamdata_local->stream + 0xc) + local_48,_send_ts_local);
      bwest_str_local._4_4_ = (int)iVar1;
      if (-1 < bwest_str_local._4_4_) {
        bwest_str_local._4_4_ = 0;
      }
    }
  }
  return bwest_str_local._4_4_;
}

Assistant:

int
WebRtcIsac_EstimateBandwidth(
    BwEstimatorstr*           bwest_str,
    Bitstr*                   streamdata,
    size_t                packet_size,
    uint16_t              rtp_seq_number,
    uint32_t              send_ts,
    uint32_t              arr_ts,
    enum IsacSamplingRate encoderSampRate,
    enum IsacSamplingRate decoderSampRate)
{
  int16_t  index;
  int16_t  frame_samples;
  uint32_t sendTimestampIn16kHz;
  uint32_t arrivalTimestampIn16kHz;
  uint32_t diffSendTime;
  uint32_t diffArrivalTime;
  int err;

  /* decode framelength and BW estimation */
  err = WebRtcIsac_DecodeFrameLen(streamdata, &frame_samples);
  if(err < 0)  // error check
  {
    return err;
  }
  err = WebRtcIsac_DecodeSendBW(streamdata, &index);
  if(err < 0)  // error check
  {
    return err;
  }

  /* UPDATE ESTIMATES FROM OTHER SIDE */
  err = WebRtcIsac_UpdateUplinkBwImpl(bwest_str, index, encoderSampRate);
  if(err < 0)
  {
    return err;
  }

  // We like BWE to work at 16 kHz sampling rate,
  // therefore, we have to change the timestamps accordingly.
  // translate the send timestamp if required
  diffSendTime = (uint32_t)((uint32_t)send_ts -
                                  (uint32_t)bwest_str->senderTimestamp);
  bwest_str->senderTimestamp = send_ts;

  diffArrivalTime = (uint32_t)((uint32_t)arr_ts -
                                     (uint32_t)bwest_str->receiverTimestamp);
  bwest_str->receiverTimestamp = arr_ts;

  if(decoderSampRate == kIsacSuperWideband)
  {
    diffArrivalTime = (uint32_t)diffArrivalTime >> 1;
    diffSendTime = (uint32_t)diffSendTime >> 1;
  }

  // arrival timestamp in 16 kHz
  arrivalTimestampIn16kHz = (uint32_t)((uint32_t)
                                             bwest_str->prev_rec_arr_ts + (uint32_t)diffArrivalTime);
  // send timestamp in 16 kHz
  sendTimestampIn16kHz = (uint32_t)((uint32_t)
                                          bwest_str->prev_rec_send_ts + (uint32_t)diffSendTime);

  err = WebRtcIsac_UpdateBandwidthEstimator(bwest_str, rtp_seq_number,
                                            (frame_samples * 1000) / FS, sendTimestampIn16kHz,
                                            arrivalTimestampIn16kHz, packet_size);
  // error check
  if(err < 0)
  {
    return err;
  }

  return 0;
}